

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx2::BVHNIntersector1<8,_1,_false,_embree::avx2::SubGridIntersector1Moeller<8,_true>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  ushort uVar10;
  RTCFilterFunctionN p_Var11;
  long lVar12;
  RTCIntersectArguments *pRVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  byte bVar27;
  int iVar28;
  GridMesh *mesh;
  ulong uVar29;
  long lVar30;
  uint uVar31;
  undefined4 uVar32;
  ulong uVar33;
  long lVar34;
  uint uVar35;
  ulong uVar36;
  ulong uVar37;
  ulong uVar38;
  ulong uVar39;
  uint uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  uint uVar44;
  ulong uVar45;
  long lVar46;
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  float fVar51;
  float fVar52;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  undefined1 auVar53 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined8 uVar65;
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  uint uVar75;
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [64];
  undefined1 auVar86 [32];
  undefined1 auVar87 [64];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [64];
  uint uVar95;
  undefined1 auVar91 [16];
  uint uVar93;
  uint uVar94;
  float fVar96;
  float fVar97;
  float fVar98;
  float fVar99;
  undefined1 auVar92 [64];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [64];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [64];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [64];
  undefined1 auVar114 [64];
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [564];
  ulong *local_1610;
  int local_15e4;
  Geometry *local_15e0;
  ulong local_15d8;
  ulong local_15d0;
  ulong local_15c8;
  ulong local_15c0;
  ulong local_15b8;
  ulong local_15b0;
  long local_15a8;
  long local_15a0;
  ulong local_1598;
  ulong local_1590;
  ulong local_1588;
  ulong local_1580;
  ulong local_1578;
  ulong local_1570;
  ulong local_1568;
  ulong local_1560;
  long local_1558;
  undefined4 local_1550;
  undefined4 local_154c;
  undefined4 local_1548;
  float local_1544;
  float local_1540;
  uint local_153c;
  uint local_1538;
  uint local_1534;
  uint local_1530;
  RTCFilterFunctionNArguments local_1520;
  undefined1 local_14f0 [16];
  undefined1 local_14e0 [32];
  undefined1 local_14c0 [32];
  undefined1 local_14a0 [8];
  float fStack_1498;
  float fStack_1494;
  float fStack_1490;
  float fStack_148c;
  float fStack_1488;
  undefined1 local_1480 [32];
  undefined1 local_1460 [32];
  undefined1 local_1440 [32];
  undefined1 local_1420 [32];
  undefined1 local_1400 [32];
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 local_13a0 [32];
  undefined1 local_1380 [32];
  undefined1 local_1360 [32];
  undefined1 local_1340 [32];
  undefined1 local_1320 [32];
  undefined1 local_12e0 [32];
  float local_12c0 [4];
  float fStack_12b0;
  float fStack_12ac;
  float fStack_12a8;
  float fStack_12a4;
  float local_12a0 [4];
  float fStack_1290;
  float fStack_128c;
  float fStack_1288;
  float fStack_1284;
  undefined1 local_1280 [32];
  undefined1 local_1260 [32];
  undefined1 local_1240 [32];
  undefined1 local_1220 [32];
  ulong local_1200 [570];
  
  local_1200[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_1200[0] != 8) {
    fVar1 = ray->tfar;
    if (0.0 <= fVar1) {
      local_1610 = local_1200 + 1;
      auVar14 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      aVar2 = (ray->dir).field_0;
      auVar71._8_4_ = 0x7fffffff;
      auVar71._0_8_ = 0x7fffffff7fffffff;
      auVar71._12_4_ = 0x7fffffff;
      auVar71 = vandps_avx((undefined1  [16])aVar2,auVar71);
      auVar77._8_4_ = 0x219392ef;
      auVar77._0_8_ = 0x219392ef219392ef;
      auVar77._12_4_ = 0x219392ef;
      auVar71 = vcmpps_avx(auVar71,auVar77,1);
      auVar71 = vblendvps_avx((undefined1  [16])aVar2,auVar77,auVar71);
      auVar77 = vrcpps_avx(auVar71);
      auVar78._8_4_ = 0x3f800000;
      auVar78._0_8_ = 0x3f8000003f800000;
      auVar78._12_4_ = 0x3f800000;
      auVar71 = vfnmadd231ps_fma(auVar78,auVar77,auVar71);
      auVar17 = vfmadd132ps_fma(auVar71,auVar77,auVar77);
      fVar76 = auVar17._0_4_;
      auVar114 = ZEXT3264(CONCAT428(fVar76,CONCAT424(fVar76,CONCAT420(fVar76,CONCAT416(fVar76,
                                                  CONCAT412(fVar76,CONCAT48(fVar76,CONCAT44(fVar76,
                                                  fVar76))))))));
      auVar71 = vmovshdup_avx(auVar17);
      uVar65 = auVar71._0_8_;
      local_1400._8_8_ = uVar65;
      local_1400._0_8_ = uVar65;
      local_1400._16_8_ = uVar65;
      local_1400._24_8_ = uVar65;
      auVar78 = vshufpd_avx(auVar17,auVar17,1);
      auVar77 = vshufps_avx(auVar17,auVar17,0xaa);
      auVar79._0_4_ = fVar76 * (ray->org).field_0.m128[0];
      auVar79._4_4_ = auVar17._4_4_ * (ray->org).field_0.m128[1];
      auVar79._8_4_ = auVar17._8_4_ * (ray->org).field_0.m128[2];
      auVar79._12_4_ = auVar17._12_4_ * (ray->org).field_0.m128[3];
      uVar65 = auVar77._0_8_;
      local_1420._8_8_ = uVar65;
      local_1420._0_8_ = uVar65;
      local_1420._16_8_ = uVar65;
      local_1420._24_8_ = uVar65;
      auVar77 = vmovshdup_avx(auVar79);
      auVar17 = vshufps_avx(auVar79,auVar79,0xaa);
      uVar36 = (ulong)(fVar76 < 0.0) << 5;
      auVar85 = ZEXT3264(local_1400);
      uVar37 = (ulong)(auVar71._0_4_ < 0.0) << 5 | 0x40;
      auVar87 = ZEXT3264(local_1420);
      uVar38 = (ulong)(auVar78._0_4_ < 0.0) << 5 | 0x80;
      uVar39 = uVar36 ^ 0x20;
      uVar41 = uVar37 ^ 0x20;
      uVar45 = uVar38 ^ 0x20;
      uVar43 = CONCAT44(auVar79._0_4_,auVar79._0_4_);
      local_1440._0_8_ = uVar43 ^ 0x8000000080000000;
      local_1440._8_4_ = -auVar79._0_4_;
      local_1440._12_4_ = -auVar79._0_4_;
      local_1440._16_4_ = -auVar79._0_4_;
      local_1440._20_4_ = -auVar79._0_4_;
      local_1440._24_4_ = -auVar79._0_4_;
      local_1440._28_4_ = -auVar79._0_4_;
      auVar90 = ZEXT3264(local_1440);
      uVar31 = auVar77._0_4_;
      uVar75 = auVar77._4_4_;
      local_1460._0_8_ = auVar77._0_8_ ^ 0x8000000080000000;
      local_1460._8_4_ = uVar31 ^ 0x80000000;
      local_1460._12_4_ = uVar75 ^ 0x80000000;
      local_1460._16_4_ = uVar31 ^ 0x80000000;
      local_1460._20_4_ = uVar75 ^ 0x80000000;
      local_1460._24_4_ = uVar31 ^ 0x80000000;
      local_1460._28_4_ = uVar75 ^ 0x80000000;
      auVar92 = ZEXT3264(local_1460);
      uVar31 = auVar17._0_4_;
      uVar75 = auVar17._4_4_;
      local_13a0._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
      local_13a0._8_4_ = uVar31 ^ 0x80000000;
      local_13a0._12_4_ = uVar75 ^ 0x80000000;
      local_13a0._16_4_ = uVar31 ^ 0x80000000;
      local_13a0._20_4_ = uVar75 ^ 0x80000000;
      local_13a0._24_4_ = uVar31 ^ 0x80000000;
      local_13a0._28_4_ = uVar75 ^ 0x80000000;
      auVar107 = ZEXT3264(local_13a0);
      uVar32 = auVar14._0_4_;
      local_13c0._4_4_ = uVar32;
      local_13c0._0_4_ = uVar32;
      local_13c0._8_4_ = uVar32;
      local_13c0._12_4_ = uVar32;
      local_13c0._16_4_ = uVar32;
      local_13c0._20_4_ = uVar32;
      local_13c0._24_4_ = uVar32;
      local_13c0._28_4_ = uVar32;
      auVar110 = ZEXT3264(local_13c0);
      local_13e0._4_4_ = fVar1;
      local_13e0._0_4_ = fVar1;
      local_13e0._8_4_ = fVar1;
      local_13e0._12_4_ = fVar1;
      local_13e0._16_4_ = fVar1;
      local_13e0._20_4_ = fVar1;
      local_13e0._24_4_ = fVar1;
      local_13e0._28_4_ = fVar1;
      auVar113 = ZEXT3264(local_13e0);
      local_15b0 = (ulong)(((uint)(fVar76 < 0.0) << 5) >> 2);
      local_15b8 = uVar39 >> 2;
      local_15c0 = uVar37 >> 2;
      local_15c8 = uVar41 >> 2;
      local_14e0._16_16_ = mm_lookupmask_ps._240_16_;
      local_14e0._0_16_ = mm_lookupmask_ps._240_16_;
      local_15d0 = uVar38 >> 2;
      local_1480 = vperm2f128_avx(local_14e0,mm_lookupmask_ps._0_32_,2);
      local_15d8 = uVar45 >> 2;
      auVar47._8_4_ = 0xbf800000;
      auVar47._0_8_ = 0xbf800000bf800000;
      auVar47._12_4_ = 0xbf800000;
      auVar47._16_4_ = 0xbf800000;
      auVar47._20_4_ = 0xbf800000;
      auVar47._24_4_ = 0xbf800000;
      auVar47._28_4_ = 0xbf800000;
      auVar63._8_4_ = 0x3f800000;
      auVar63._0_8_ = 0x3f8000003f800000;
      auVar63._12_4_ = 0x3f800000;
      auVar63._16_4_ = 0x3f800000;
      auVar63._20_4_ = 0x3f800000;
      auVar63._24_4_ = 0x3f800000;
      auVar63._28_4_ = 0x3f800000;
      _local_14a0 = vblendvps_avx(auVar63,auVar47,local_1480);
      local_1560 = uVar36;
      local_1568 = uVar37;
      local_1570 = uVar38;
      local_1578 = uVar39;
      local_1580 = uVar41;
      local_1588 = uVar45;
LAB_01538576:
      if (local_1610 != local_1200) {
        uVar43 = local_1610[-1];
        local_1610 = local_1610 + -1;
        while ((uVar43 & 8) == 0) {
          auVar71 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar36),auVar90._0_32_,
                                    auVar114._0_32_);
          auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar37),auVar92._0_32_,
                                    auVar85._0_32_);
          auVar47 = vpmaxsd_avx2(ZEXT1632(auVar71),ZEXT1632(auVar14));
          auVar71 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar38),auVar107._0_32_,
                                    auVar87._0_32_);
          auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar39),auVar90._0_32_,
                                    auVar114._0_32_);
          auVar77 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar41),auVar92._0_32_,
                                    auVar85._0_32_);
          auVar66 = vpminsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar77));
          auVar14 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar43 + 0x40 + uVar45),auVar107._0_32_,
                                    auVar87._0_32_);
          auVar63 = vpmaxsd_avx2(ZEXT1632(auVar71),auVar110._0_32_);
          auVar47 = vpmaxsd_avx2(auVar47,auVar63);
          auVar63 = vpminsd_avx2(ZEXT1632(auVar14),auVar113._0_32_);
          auVar63 = vpminsd_avx2(auVar66,auVar63);
          auVar47 = vpcmpgtd_avx2(auVar47,auVar63);
          iVar28 = vmovmskps_avx(auVar47);
          if (iVar28 == 0xff) goto LAB_01538576;
          bVar27 = ~(byte)iVar28;
          uVar29 = uVar43 & 0xfffffffffffffff0;
          lVar30 = 0;
          for (uVar43 = (ulong)bVar27; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000)
          {
            lVar30 = lVar30 + 1;
          }
          uVar43 = *(ulong *)(uVar29 + lVar30 * 8);
          uVar31 = bVar27 - 1 & (uint)bVar27;
          uVar33 = (ulong)uVar31;
          if (uVar31 != 0) {
            do {
              *local_1610 = uVar43;
              local_1610 = local_1610 + 1;
              lVar30 = 0;
              for (uVar43 = uVar33; (uVar43 & 1) == 0; uVar43 = uVar43 >> 1 | 0x8000000000000000) {
                lVar30 = lVar30 + 1;
              }
              uVar33 = uVar33 - 1 & uVar33;
              uVar43 = *(ulong *)(uVar29 + lVar30 * 8);
            } while (uVar33 != 0);
          }
        }
        local_15a8 = (ulong)((uint)uVar43 & 0xf) - 8;
        uVar43 = uVar43 & 0xfffffffffffffff0;
        for (local_15a0 = 0; local_15a0 != local_15a8; local_15a0 = local_15a0 + 1) {
          lVar30 = local_15a0 * 0x90;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = *(ulong *)(uVar43 + 0x40 + lVar30);
          auVar14 = vpmovzxbw_avx(auVar14);
          local_1558 = uVar43 + lVar30;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *(ulong *)(uVar43 + 0x48 + lVar30);
          auVar71 = vpmovzxbw_avx(auVar17);
          auVar71 = vpminuw_avx(auVar14,auVar71);
          auVar71 = vpcmpeqw_avx(auVar14,auVar71);
          auVar71 = vpacksswb_avx(auVar71,auVar71);
          uVar32 = *(undefined4 *)(uVar43 + 0x70 + lVar30);
          auVar66._4_4_ = uVar32;
          auVar66._0_4_ = uVar32;
          auVar66._8_4_ = uVar32;
          auVar66._12_4_ = uVar32;
          auVar66._16_4_ = uVar32;
          auVar66._20_4_ = uVar32;
          auVar66._24_4_ = uVar32;
          auVar66._28_4_ = uVar32;
          uVar32 = *(undefined4 *)(uVar43 + 0x7c + lVar30);
          auVar72._4_4_ = uVar32;
          auVar72._0_4_ = uVar32;
          auVar72._8_4_ = uVar32;
          auVar72._12_4_ = uVar32;
          auVar72._16_4_ = uVar32;
          auVar72._20_4_ = uVar32;
          auVar72._24_4_ = uVar32;
          auVar72._28_4_ = uVar32;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)(local_15b0 + 0x40 + local_1558);
          auVar47 = vpmovzxbd_avx2(auVar3);
          auVar47 = vcvtdq2ps_avx(auVar47);
          auVar14 = vfmadd213ps_fma(auVar47,auVar72,auVar66);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = *(ulong *)(local_15b8 + 0x40 + local_1558);
          auVar47 = vpmovzxbd_avx2(auVar4);
          auVar47 = vcvtdq2ps_avx(auVar47);
          auVar77 = vfmadd213ps_fma(auVar47,auVar72,auVar66);
          uVar32 = *(undefined4 *)(uVar43 + 0x74 + lVar30);
          auVar67._4_4_ = uVar32;
          auVar67._0_4_ = uVar32;
          auVar67._8_4_ = uVar32;
          auVar67._12_4_ = uVar32;
          auVar67._16_4_ = uVar32;
          auVar67._20_4_ = uVar32;
          auVar67._24_4_ = uVar32;
          auVar67._28_4_ = uVar32;
          uVar32 = *(undefined4 *)(uVar43 + 0x80 + lVar30);
          auVar73._4_4_ = uVar32;
          auVar73._0_4_ = uVar32;
          auVar73._8_4_ = uVar32;
          auVar73._12_4_ = uVar32;
          auVar73._16_4_ = uVar32;
          auVar73._20_4_ = uVar32;
          auVar73._24_4_ = uVar32;
          auVar73._28_4_ = uVar32;
          auVar5._8_8_ = 0;
          auVar5._0_8_ = *(ulong *)(local_15c0 + 0x40 + local_1558);
          auVar47 = vpmovzxbd_avx2(auVar5);
          auVar47 = vcvtdq2ps_avx(auVar47);
          auVar78 = vfmadd213ps_fma(auVar47,auVar73,auVar67);
          auVar6._8_8_ = 0;
          auVar6._0_8_ = *(ulong *)(local_15c8 + 0x40 + local_1558);
          auVar47 = vpmovzxbd_avx2(auVar6);
          auVar47 = vcvtdq2ps_avx(auVar47);
          auVar17 = vfmadd213ps_fma(auVar47,auVar73,auVar67);
          uVar32 = *(undefined4 *)(uVar43 + 0x78 + lVar30);
          auVar68._4_4_ = uVar32;
          auVar68._0_4_ = uVar32;
          auVar68._8_4_ = uVar32;
          auVar68._12_4_ = uVar32;
          auVar68._16_4_ = uVar32;
          auVar68._20_4_ = uVar32;
          auVar68._24_4_ = uVar32;
          auVar68._28_4_ = uVar32;
          uVar32 = *(undefined4 *)(uVar43 + 0x84 + lVar30);
          auVar74._4_4_ = uVar32;
          auVar74._0_4_ = uVar32;
          auVar74._8_4_ = uVar32;
          auVar74._12_4_ = uVar32;
          auVar74._16_4_ = uVar32;
          auVar74._20_4_ = uVar32;
          auVar74._24_4_ = uVar32;
          auVar74._28_4_ = uVar32;
          auVar7._8_8_ = 0;
          auVar7._0_8_ = *(ulong *)(local_15d0 + 0x40 + local_1558);
          auVar47 = vpmovzxbd_avx2(auVar7);
          auVar47 = vcvtdq2ps_avx(auVar47);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = *(ulong *)(local_15d8 + 0x40 + local_1558);
          auVar63 = vpmovzxbd_avx2(auVar8);
          auVar79 = vfmadd213ps_fma(auVar47,auVar74,auVar68);
          auVar47 = vcvtdq2ps_avx(auVar63);
          auVar3 = vfmadd213ps_fma(auVar47,auVar74,auVar68);
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar14),auVar114._0_32_,auVar90._0_32_);
          auVar78 = vfmadd213ps_fma(ZEXT1632(auVar78),auVar85._0_32_,auVar92._0_32_);
          auVar47 = vpmaxsd_avx2(ZEXT1632(auVar14),ZEXT1632(auVar78));
          auVar14 = vfmadd213ps_fma(ZEXT1632(auVar79),auVar87._0_32_,auVar107._0_32_);
          auVar77 = vfmadd213ps_fma(ZEXT1632(auVar77),auVar114._0_32_,auVar90._0_32_);
          auVar78 = vfmadd213ps_fma(ZEXT1632(auVar17),auVar85._0_32_,auVar92._0_32_);
          auVar66 = vpminsd_avx2(ZEXT1632(auVar77),ZEXT1632(auVar78));
          auVar77 = vfmadd213ps_fma(ZEXT1632(auVar3),auVar87._0_32_,auVar107._0_32_);
          auVar63 = vpmaxsd_avx2(ZEXT1632(auVar14),auVar110._0_32_);
          auVar47 = vpmaxsd_avx2(auVar47,auVar63);
          auVar63 = vpminsd_avx2(ZEXT1632(auVar77),auVar113._0_32_);
          auVar63 = vpminsd_avx2(auVar66,auVar63);
          auVar47 = vpcmpgtd_avx2(auVar47,auVar63);
          uVar32 = vmovmskps_avx(auVar47);
          for (uVar29 = (ulong)(byte)(~(byte)uVar32 &
                                     (SUB161(auVar71 >> 7,0) & 1 |
                                      (SUB161(auVar71 >> 0xf,0) & 1) << 1 |
                                      (SUB161(auVar71 >> 0x17,0) & 1) << 2 |
                                      (SUB161(auVar71 >> 0x1f,0) & 1) << 3 |
                                      (SUB161(auVar71 >> 0x27,0) & 1) << 4 |
                                      (SUB161(auVar71 >> 0x2f,0) & 1) << 5 |
                                      (SUB161(auVar71 >> 0x37,0) & 1) << 6 |
                                     SUB161(auVar71 >> 0x3f,0) << 7)); uVar29 != 0;
              uVar29 = uVar29 - 1 & uVar29) {
            lVar30 = 0;
            for (uVar36 = uVar29; (uVar36 & 1) == 0; uVar36 = uVar36 >> 1 | 0x8000000000000000) {
              lVar30 = lVar30 + 1;
            }
            uVar9 = *(ushort *)(local_1558 + lVar30 * 8);
            uVar10 = *(ushort *)(local_1558 + 2 + lVar30 * 8);
            uVar31 = *(uint *)(local_1558 + 0x88);
            uVar75 = *(uint *)(local_1558 + 4 + lVar30 * 8);
            local_1590 = (ulong)uVar31;
            local_15e0 = (context->scene->geometries).items[uVar31].ptr;
            lVar30 = *(long *)&local_15e0->field_0x58;
            local_1598 = (ulong)uVar75;
            lVar34 = local_15e0[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i
                     * (ulong)uVar75;
            uVar40 = uVar9 & 0x7fff;
            uVar44 = uVar10 & 0x7fff;
            uVar35 = *(uint *)(lVar30 + 4 + lVar34);
            uVar37 = (ulong)uVar35;
            uVar38 = (ulong)(uVar35 * uVar44 + *(int *)(lVar30 + lVar34) + uVar40);
            p_Var11 = local_15e0[1].intersectionFilterN;
            lVar12 = *(long *)&local_15e0[1].time_range.upper;
            auVar71 = *(undefined1 (*) [16])(lVar12 + (uVar38 + 1) * (long)p_Var11);
            auVar14 = *(undefined1 (*) [16])(lVar12 + (uVar38 + uVar37) * (long)p_Var11);
            lVar42 = uVar38 + uVar37 + 1;
            auVar77 = *(undefined1 (*) [16])(lVar12 + lVar42 * (long)p_Var11);
            auVar78 = *(undefined1 (*) [16])
                       (lVar12 + (uVar38 + (-1 < (short)uVar9) + 1) * (long)p_Var11);
            lVar46 = (ulong)(-1 < (short)uVar9) + lVar42;
            uVar36 = 0;
            if (-1 < (short)uVar10) {
              uVar36 = uVar37;
            }
            auVar17 = *(undefined1 (*) [16])(lVar12 + lVar46 * (long)p_Var11);
            auVar79 = *(undefined1 (*) [16])(lVar12 + (uVar38 + uVar37 + uVar36) * (long)p_Var11);
            auVar3 = *(undefined1 (*) [16])(lVar12 + (lVar42 + uVar36) * (long)p_Var11);
            auVar88._16_16_ = *(undefined1 (*) [16])(lVar12 + (uVar36 + lVar46) * (long)p_Var11);
            auVar88._0_16_ = auVar77;
            auVar5 = vunpcklps_avx(auVar71,auVar17);
            auVar4 = vunpckhps_avx(auVar71,auVar17);
            auVar6 = vunpcklps_avx(auVar78,auVar77);
            auVar78 = vunpckhps_avx(auVar78,auVar77);
            auVar7 = vunpcklps_avx(auVar4,auVar78);
            auVar8 = vunpcklps_avx(auVar5,auVar6);
            auVar78 = vunpckhps_avx(auVar5,auVar6);
            auVar5 = vunpcklps_avx(auVar14,auVar3);
            auVar4 = vunpckhps_avx(auVar14,auVar3);
            auVar6 = vunpcklps_avx(auVar77,auVar79);
            auVar79 = vunpckhps_avx(auVar77,auVar79);
            auVar4 = vunpcklps_avx(auVar4,auVar79);
            auVar80 = vunpcklps_avx(auVar5,auVar6);
            auVar79 = vunpckhps_avx(auVar5,auVar6);
            auVar86._16_16_ = auVar3;
            auVar86._0_16_ = auVar14;
            auVar53._16_16_ = auVar17;
            auVar53._0_16_ = auVar71;
            auVar47 = vunpcklps_avx(auVar53,auVar86);
            auVar48._16_16_ = auVar77;
            auVar48._0_16_ = *(undefined1 (*) [16])(lVar12 + (long)p_Var11 * uVar38);
            auVar63 = vunpcklps_avx(auVar48,auVar88);
            auVar15 = vunpcklps_avx(auVar63,auVar47);
            auVar74 = vunpckhps_avx(auVar63,auVar47);
            auVar47 = vunpckhps_avx(auVar53,auVar86);
            auVar63 = vunpckhps_avx(auVar48,auVar88);
            auVar16 = vunpcklps_avx(auVar63,auVar47);
            auVar49._16_16_ = auVar8;
            auVar49._0_16_ = auVar8;
            auVar69._16_16_ = auVar78;
            auVar69._0_16_ = auVar78;
            auVar81._16_16_ = auVar7;
            auVar81._0_16_ = auVar7;
            auVar100._16_16_ = auVar80;
            auVar100._0_16_ = auVar80;
            auVar103._16_16_ = auVar79;
            auVar103._0_16_ = auVar79;
            auVar106._16_16_ = auVar4;
            auVar106._0_16_ = auVar4;
            auVar63 = vsubps_avx(auVar15,auVar49);
            auVar47 = vsubps_avx(auVar74,auVar69);
            auVar66 = vsubps_avx(auVar16,auVar81);
            auVar67 = vsubps_avx(auVar100,auVar15);
            auVar68 = vsubps_avx(auVar103,auVar74);
            auVar72 = vsubps_avx(auVar106,auVar16);
            auVar18._4_4_ = auVar47._4_4_ * auVar72._4_4_;
            auVar18._0_4_ = auVar47._0_4_ * auVar72._0_4_;
            auVar18._8_4_ = auVar47._8_4_ * auVar72._8_4_;
            auVar18._12_4_ = auVar47._12_4_ * auVar72._12_4_;
            auVar18._16_4_ = auVar47._16_4_ * auVar72._16_4_;
            auVar18._20_4_ = auVar47._20_4_ * auVar72._20_4_;
            auVar18._24_4_ = auVar47._24_4_ * auVar72._24_4_;
            auVar18._28_4_ = auVar8._12_4_;
            uVar32 = *(undefined4 *)&(ray->org).field_0;
            auVar70._4_4_ = uVar32;
            auVar70._0_4_ = uVar32;
            auVar70._8_4_ = uVar32;
            auVar70._12_4_ = uVar32;
            auVar70._16_4_ = uVar32;
            auVar70._20_4_ = uVar32;
            auVar70._24_4_ = uVar32;
            auVar70._28_4_ = uVar32;
            uVar32 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
            auVar108._4_4_ = uVar32;
            auVar108._0_4_ = uVar32;
            auVar108._8_4_ = uVar32;
            auVar108._12_4_ = uVar32;
            auVar108._16_4_ = uVar32;
            auVar108._20_4_ = uVar32;
            auVar108._24_4_ = uVar32;
            auVar108._28_4_ = uVar32;
            uVar32 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
            auVar111._4_4_ = uVar32;
            auVar111._0_4_ = uVar32;
            auVar111._8_4_ = uVar32;
            auVar111._12_4_ = uVar32;
            auVar111._16_4_ = uVar32;
            auVar111._20_4_ = uVar32;
            auVar111._24_4_ = uVar32;
            auVar111._28_4_ = uVar32;
            fVar1 = (ray->dir).field_0.m128[0];
            auVar101._4_4_ = fVar1;
            auVar101._0_4_ = fVar1;
            auVar101._8_4_ = fVar1;
            auVar101._12_4_ = fVar1;
            auVar101._16_4_ = fVar1;
            auVar101._20_4_ = fVar1;
            auVar101._24_4_ = fVar1;
            auVar101._28_4_ = fVar1;
            auVar78 = vfmsub231ps_fma(auVar18,auVar68,auVar66);
            fVar76 = (ray->dir).field_0.m128[1];
            auVar104._4_4_ = fVar76;
            auVar104._0_4_ = fVar76;
            auVar104._8_4_ = fVar76;
            auVar104._12_4_ = fVar76;
            auVar104._16_4_ = fVar76;
            auVar104._20_4_ = fVar76;
            auVar104._24_4_ = fVar76;
            auVar104._28_4_ = fVar76;
            auVar73 = vsubps_avx(auVar15,auVar70);
            auVar19._4_4_ = auVar66._4_4_ * auVar67._4_4_;
            auVar19._0_4_ = auVar66._0_4_ * auVar67._0_4_;
            auVar19._8_4_ = auVar66._8_4_ * auVar67._8_4_;
            auVar19._12_4_ = auVar66._12_4_ * auVar67._12_4_;
            auVar19._16_4_ = auVar66._16_4_ * auVar67._16_4_;
            auVar19._20_4_ = auVar66._20_4_ * auVar67._20_4_;
            auVar19._24_4_ = auVar66._24_4_ * auVar67._24_4_;
            auVar19._28_4_ = auVar15._28_4_;
            auVar74 = vsubps_avx(auVar74,auVar108);
            fVar96 = (ray->dir).field_0.m128[2];
            auVar109._4_4_ = fVar96;
            auVar109._0_4_ = fVar96;
            auVar109._8_4_ = fVar96;
            auVar109._12_4_ = fVar96;
            auVar109._16_4_ = fVar96;
            auVar109._20_4_ = fVar96;
            auVar109._24_4_ = fVar96;
            auVar109._28_4_ = fVar96;
            auVar17 = vfmsub231ps_fma(auVar19,auVar72,auVar63);
            auVar15 = vsubps_avx(auVar16,auVar111);
            auVar16._4_4_ = fVar1 * auVar74._4_4_;
            auVar16._0_4_ = fVar1 * auVar74._0_4_;
            auVar16._8_4_ = fVar1 * auVar74._8_4_;
            auVar16._12_4_ = fVar1 * auVar74._12_4_;
            auVar16._16_4_ = fVar1 * auVar74._16_4_;
            auVar16._20_4_ = fVar1 * auVar74._20_4_;
            auVar16._24_4_ = fVar1 * auVar74._24_4_;
            auVar16._28_4_ = uVar32;
            auVar71 = vfmsub231ps_fma(auVar16,auVar73,auVar104);
            auVar20._4_4_ = auVar72._4_4_ * auVar71._4_4_;
            auVar20._0_4_ = auVar72._0_4_ * auVar71._0_4_;
            auVar20._8_4_ = auVar72._8_4_ * auVar71._8_4_;
            auVar20._12_4_ = auVar72._12_4_ * auVar71._12_4_;
            auVar20._16_4_ = auVar72._16_4_ * 0.0;
            auVar20._20_4_ = auVar72._20_4_ * 0.0;
            auVar20._24_4_ = auVar72._24_4_ * 0.0;
            auVar20._28_4_ = auVar72._28_4_;
            auVar112._0_4_ = auVar66._0_4_ * auVar71._0_4_;
            auVar112._4_4_ = auVar66._4_4_ * auVar71._4_4_;
            auVar112._8_4_ = auVar66._8_4_ * auVar71._8_4_;
            auVar112._12_4_ = auVar66._12_4_ * auVar71._12_4_;
            auVar112._16_4_ = auVar66._16_4_ * 0.0;
            auVar112._20_4_ = auVar66._20_4_ * 0.0;
            auVar112._24_4_ = auVar66._24_4_ * 0.0;
            auVar112._28_4_ = 0;
            auVar21._4_4_ = fVar96 * auVar73._4_4_;
            auVar21._0_4_ = fVar96 * auVar73._0_4_;
            auVar21._8_4_ = fVar96 * auVar73._8_4_;
            auVar21._12_4_ = fVar96 * auVar73._12_4_;
            auVar21._16_4_ = fVar96 * auVar73._16_4_;
            auVar21._20_4_ = fVar96 * auVar73._20_4_;
            auVar21._24_4_ = fVar96 * auVar73._24_4_;
            auVar21._28_4_ = auVar66._28_4_;
            auVar14 = vfmsub231ps_fma(auVar21,auVar15,auVar101);
            auVar71 = vfmadd231ps_fma(auVar20,ZEXT1632(auVar14),auVar68);
            auVar14 = vfmadd231ps_fma(auVar112,auVar47,ZEXT1632(auVar14));
            auVar22._4_4_ = auVar63._4_4_ * auVar68._4_4_;
            auVar22._0_4_ = auVar63._0_4_ * auVar68._0_4_;
            auVar22._8_4_ = auVar63._8_4_ * auVar68._8_4_;
            auVar22._12_4_ = auVar63._12_4_ * auVar68._12_4_;
            auVar22._16_4_ = auVar63._16_4_ * auVar68._16_4_;
            auVar22._20_4_ = auVar63._20_4_ * auVar68._20_4_;
            auVar22._24_4_ = auVar63._24_4_ * auVar68._24_4_;
            auVar22._28_4_ = auVar68._28_4_;
            auVar77 = vfmsub231ps_fma(auVar22,auVar67,auVar47);
            auVar23._4_4_ = fVar76 * auVar15._4_4_;
            auVar23._0_4_ = fVar76 * auVar15._0_4_;
            auVar23._8_4_ = fVar76 * auVar15._8_4_;
            auVar23._12_4_ = fVar76 * auVar15._12_4_;
            auVar23._16_4_ = fVar76 * auVar15._16_4_;
            auVar23._20_4_ = fVar76 * auVar15._20_4_;
            auVar23._24_4_ = fVar76 * auVar15._24_4_;
            auVar23._28_4_ = auVar47._28_4_;
            auVar79 = vfmsub231ps_fma(auVar23,auVar74,auVar109);
            fVar1 = auVar77._0_4_;
            fVar76 = auVar77._4_4_;
            auVar24._4_4_ = fVar96 * fVar76;
            auVar24._0_4_ = fVar96 * fVar1;
            fVar52 = auVar77._8_4_;
            auVar24._8_4_ = fVar96 * fVar52;
            fVar55 = auVar77._12_4_;
            auVar24._12_4_ = fVar96 * fVar55;
            auVar24._16_4_ = fVar96 * 0.0;
            auVar24._20_4_ = fVar96 * 0.0;
            auVar24._24_4_ = fVar96 * 0.0;
            auVar24._28_4_ = fVar96;
            auVar77 = vfmadd231ps_fma(auVar24,ZEXT1632(auVar17),auVar104);
            auVar77 = vfmadd231ps_fma(ZEXT1632(auVar77),ZEXT1632(auVar78),auVar101);
            auVar102._8_4_ = 0x7fffffff;
            auVar102._0_8_ = 0x7fffffff7fffffff;
            auVar102._12_4_ = 0x7fffffff;
            auVar102._16_4_ = 0x7fffffff;
            auVar102._20_4_ = 0x7fffffff;
            auVar102._24_4_ = 0x7fffffff;
            auVar102._28_4_ = 0x7fffffff;
            auVar71 = vfmadd231ps_fma(ZEXT1632(auVar71),ZEXT1632(auVar79),auVar67);
            auVar82._8_8_ = 0x8000000080000000;
            auVar82._0_8_ = 0x8000000080000000;
            auVar82._16_8_ = 0x8000000080000000;
            auVar82._24_8_ = 0x8000000080000000;
            auVar47 = vandps_avx(ZEXT1632(auVar77),auVar82);
            uVar35 = auVar47._0_4_;
            auVar83._0_4_ = (float)(uVar35 ^ auVar71._0_4_);
            uVar93 = auVar47._4_4_;
            auVar83._4_4_ = (float)(uVar93 ^ auVar71._4_4_);
            uVar94 = auVar47._8_4_;
            auVar83._8_4_ = (float)(uVar94 ^ auVar71._8_4_);
            uVar95 = auVar47._12_4_;
            auVar83._12_4_ = (float)(uVar95 ^ auVar71._12_4_);
            fVar96 = auVar47._16_4_;
            auVar83._16_4_ = fVar96;
            fVar97 = auVar47._20_4_;
            auVar83._20_4_ = fVar97;
            fVar98 = auVar47._24_4_;
            auVar83._24_4_ = fVar98;
            fVar99 = auVar47._28_4_;
            auVar83._28_4_ = fVar99;
            auVar71 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar63,ZEXT1632(auVar79));
            auVar89._0_4_ = (float)(uVar35 ^ auVar71._0_4_);
            auVar89._4_4_ = (float)(uVar93 ^ auVar71._4_4_);
            auVar89._8_4_ = (float)(uVar94 ^ auVar71._8_4_);
            auVar89._12_4_ = (float)(uVar95 ^ auVar71._12_4_);
            auVar89._16_4_ = fVar96;
            auVar89._20_4_ = fVar97;
            auVar89._24_4_ = fVar98;
            auVar89._28_4_ = fVar99;
            auVar47 = vcmpps_avx(auVar83,ZEXT832(0) << 0x20,5);
            auVar63 = vcmpps_avx(auVar89,ZEXT832(0) << 0x20,5);
            auVar47 = vandps_avx(auVar63,auVar47);
            local_1320 = vandps_avx(ZEXT1632(auVar77),auVar102);
            auVar63 = vcmpps_avx(ZEXT1632(auVar77),ZEXT832(0) << 0x20,4);
            auVar47 = vandps_avx(auVar47,auVar63);
            auVar105._0_4_ = auVar89._0_4_ + auVar83._0_4_;
            auVar105._4_4_ = auVar89._4_4_ + auVar83._4_4_;
            auVar105._8_4_ = auVar89._8_4_ + auVar83._8_4_;
            auVar105._12_4_ = auVar89._12_4_ + auVar83._12_4_;
            auVar105._16_4_ = fVar96 + fVar96;
            auVar105._20_4_ = fVar97 + fVar97;
            auVar105._24_4_ = fVar98 + fVar98;
            auVar105._28_4_ = fVar99 + fVar99;
            auVar63 = vcmpps_avx(auVar105,local_1320,2);
            auVar47 = vandps_avx(auVar47,auVar63);
            auVar63 = local_14e0 & auVar47;
            if ((((((((auVar63 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar63 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar63 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar63 >> 0x7f,0) != '\0') ||
                  (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar63 >> 0xbf,0) != '\0') ||
                (auVar63 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar63[0x1f] < '\0') {
              auVar47 = vandps_avx(auVar47,local_14e0);
              auVar25._4_4_ = fVar76 * auVar15._4_4_;
              auVar25._0_4_ = fVar1 * auVar15._0_4_;
              auVar25._8_4_ = fVar52 * auVar15._8_4_;
              auVar25._12_4_ = fVar55 * auVar15._12_4_;
              auVar25._16_4_ = auVar15._16_4_ * 0.0;
              auVar25._20_4_ = auVar15._20_4_ * 0.0;
              auVar25._24_4_ = auVar15._24_4_ * 0.0;
              auVar25._28_4_ = auVar15._28_4_;
              auVar71 = vfmadd213ps_fma(auVar74,ZEXT1632(auVar17),auVar25);
              auVar71 = vfmadd213ps_fma(auVar73,ZEXT1632(auVar78),ZEXT1632(auVar71));
              local_1340._0_4_ = (float)(uVar35 ^ auVar71._0_4_);
              local_1340._4_4_ = (float)(uVar93 ^ auVar71._4_4_);
              local_1340._8_4_ = (float)(uVar94 ^ auVar71._8_4_);
              local_1340._12_4_ = (float)(uVar95 ^ auVar71._12_4_);
              local_1340._16_4_ = fVar96;
              local_1340._20_4_ = fVar97;
              local_1340._24_4_ = fVar98;
              local_1340._28_4_ = fVar99;
              fVar57 = (ray->org).field_0.m128[3];
              fVar51 = local_1320._0_4_;
              fVar54 = local_1320._4_4_;
              auVar15._4_4_ = fVar54 * fVar57;
              auVar15._0_4_ = fVar51 * fVar57;
              fVar56 = local_1320._8_4_;
              auVar15._8_4_ = fVar56 * fVar57;
              fVar58 = local_1320._12_4_;
              auVar15._12_4_ = fVar58 * fVar57;
              fVar60 = local_1320._16_4_;
              auVar15._16_4_ = fVar60 * fVar57;
              fVar61 = local_1320._20_4_;
              auVar15._20_4_ = fVar61 * fVar57;
              fVar62 = local_1320._24_4_;
              auVar15._24_4_ = fVar62 * fVar57;
              auVar15._28_4_ = fVar57;
              auVar63 = vcmpps_avx(auVar15,local_1340,1);
              fVar57 = ray->tfar;
              auVar26._4_4_ = fVar54 * fVar57;
              auVar26._0_4_ = fVar51 * fVar57;
              auVar26._8_4_ = fVar56 * fVar57;
              auVar26._12_4_ = fVar58 * fVar57;
              auVar26._16_4_ = fVar60 * fVar57;
              auVar26._20_4_ = fVar61 * fVar57;
              auVar26._24_4_ = fVar62 * fVar57;
              auVar26._28_4_ = fVar57;
              auVar66 = vcmpps_avx(local_1340,auVar26,2);
              auVar63 = vandps_avx(auVar66,auVar63);
              auVar66 = auVar47 & auVar63;
              if ((((((((auVar66 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar66 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar66 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar66 >> 0x7f,0) != '\0') ||
                    (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar66 >> 0xbf,0) != '\0') ||
                  (auVar66 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar66[0x1f] < '\0') {
                local_14f0._0_4_ = ray->tfar;
                local_14f0._4_4_ = ray->mask;
                local_14f0._8_4_ = ray->id;
                local_14f0._12_4_ = ray->flags;
                uVar35 = vextractps_avx(local_14f0,1);
                local_12e0 = vandps_avx(auVar47,auVar63);
                auVar47 = vsubps_avx(local_1320,auVar89);
                local_1380 = vblendvps_avx(auVar83,auVar47,local_1480);
                auVar47 = vsubps_avx(local_1320,auVar83);
                local_1360 = vblendvps_avx(auVar89,auVar47,local_1480);
                local_1260._0_4_ = (float)local_14a0._0_4_ * auVar78._0_4_;
                local_1260._4_4_ = (float)local_14a0._4_4_ * auVar78._4_4_;
                local_1260._8_4_ = fStack_1498 * auVar78._8_4_;
                local_1260._12_4_ = fStack_1494 * auVar78._12_4_;
                local_1260._16_4_ = fStack_1490 * 0.0;
                local_1260._20_4_ = fStack_148c * 0.0;
                local_1260._24_4_ = fStack_1488 * 0.0;
                local_1260._28_4_ = 0;
                local_1240._4_4_ = (float)local_14a0._4_4_ * auVar17._4_4_;
                local_1240._0_4_ = (float)local_14a0._0_4_ * auVar17._0_4_;
                local_1240._8_4_ = fStack_1498 * auVar17._8_4_;
                local_1240._12_4_ = fStack_1494 * auVar17._12_4_;
                local_1240._16_4_ = fStack_1490 * 0.0;
                local_1240._20_4_ = fStack_148c * 0.0;
                local_1240._24_4_ = fStack_1488 * 0.0;
                local_1240._28_4_ = 0;
                local_1220._4_4_ = (float)local_14a0._4_4_ * fVar76;
                local_1220._0_4_ = (float)local_14a0._0_4_ * fVar1;
                local_1220._8_4_ = fStack_1498 * fVar52;
                local_1220._12_4_ = fStack_1494 * fVar55;
                local_1220._16_4_ = fStack_1490 * 0.0;
                local_1220._20_4_ = fStack_148c * 0.0;
                local_1220._24_4_ = fStack_1488 * 0.0;
                local_1220._28_4_ = 0;
                if ((local_15e0->mask & uVar35) != 0) {
                  pRVar13 = context->args;
                  if ((pRVar13->filter == (RTCFilterFunctionN)0x0) &&
                     (local_15e0->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
LAB_01538f0c:
                    ray->tfar = -INFINITY;
                    return;
                  }
                  auVar50._0_8_ = (ulong)CONCAT24(uVar9,(uint)uVar9) & 0x7fff00007fff;
                  auVar50._8_4_ = uVar40;
                  auVar50._12_4_ = uVar40;
                  auVar50._16_4_ = uVar40;
                  auVar50._20_4_ = uVar40;
                  auVar50._24_4_ = uVar40;
                  auVar50._28_4_ = uVar40;
                  auVar47 = vpaddd_avx2(auVar50,_DAT_01fb7740);
                  auVar64._0_8_ = (ulong)CONCAT24(uVar10,(uint)uVar10) & 0x7fff00007fff;
                  auVar64._8_4_ = uVar44;
                  auVar64._12_4_ = uVar44;
                  auVar64._16_4_ = uVar44;
                  auVar64._20_4_ = uVar44;
                  auVar64._24_4_ = uVar44;
                  auVar64._28_4_ = uVar44;
                  auVar63 = vpaddd_avx2(auVar64,_DAT_01fb7760);
                  auVar80._0_4_ = (float)(int)(*(ushort *)(lVar30 + 8 + lVar34) - 1);
                  auVar80._4_12_ = auVar114._4_12_;
                  auVar71 = vrcpss_avx(auVar80,auVar80);
                  auVar91._0_4_ = (float)(int)(*(ushort *)(lVar30 + 10 + lVar34) - 1);
                  auVar91._4_12_ = auVar114._4_12_;
                  auVar14 = vfnmadd213ss_fma(auVar80,auVar71,SUB6416(ZEXT464(0x40000000),0));
                  fVar1 = auVar71._0_4_ * auVar14._0_4_;
                  auVar71 = vrcpss_avx(auVar91,auVar91);
                  auVar14 = vfnmadd213ss_fma(auVar91,auVar71,SUB6416(ZEXT464(0x40000000),0));
                  fVar76 = auVar71._0_4_ * auVar14._0_4_;
                  auVar47 = vcvtdq2ps_avx(auVar47);
                  fStack_12a4 = auVar47._28_4_ + local_1380._28_4_;
                  auVar63 = vcvtdq2ps_avx(auVar63);
                  auVar66 = vrcpps_avx(local_1320);
                  auVar84._8_4_ = 0x3f800000;
                  auVar84._0_8_ = 0x3f8000003f800000;
                  auVar84._12_4_ = 0x3f800000;
                  auVar84._16_4_ = 0x3f800000;
                  auVar84._20_4_ = 0x3f800000;
                  auVar84._24_4_ = 0x3f800000;
                  auVar84._28_4_ = 0x3f800000;
                  auVar71 = vfnmadd213ps_fma(local_1320,auVar66,auVar84);
                  auVar71 = vfmadd132ps_fma(ZEXT1632(auVar71),auVar66,auVar66);
                  fVar52 = auVar71._0_4_;
                  fVar55 = auVar71._4_4_;
                  local_1280._4_4_ = fVar55 * local_1340._4_4_;
                  local_1280._0_4_ = fVar52 * local_1340._0_4_;
                  fVar57 = auVar71._8_4_;
                  local_1280._8_4_ = fVar57 * local_1340._8_4_;
                  fVar59 = auVar71._12_4_;
                  local_1280._12_4_ = fVar59 * local_1340._12_4_;
                  local_1280._16_4_ = fVar96 * 0.0;
                  local_1280._20_4_ = fVar97 * 0.0;
                  local_1280._24_4_ = fVar98 * 0.0;
                  local_1280._28_4_ = fVar99;
                  local_12c0[0] = (fVar51 * auVar47._0_4_ + local_1380._0_4_) * fVar1 * fVar52;
                  local_12c0[1] = (fVar54 * auVar47._4_4_ + local_1380._4_4_) * fVar1 * fVar55;
                  local_12c0[2] = (fVar56 * auVar47._8_4_ + local_1380._8_4_) * fVar1 * fVar57;
                  local_12c0[3] = (fVar58 * auVar47._12_4_ + local_1380._12_4_) * fVar1 * fVar59;
                  fStack_12b0 = (fVar60 * auVar47._16_4_ + local_1380._16_4_) * fVar1 * 0.0;
                  fStack_12ac = (fVar61 * auVar47._20_4_ + local_1380._20_4_) * fVar1 * 0.0;
                  fStack_12a8 = (fVar62 * auVar47._24_4_ + local_1380._24_4_) * fVar1 * 0.0;
                  local_12a0[0] = (fVar51 * auVar63._0_4_ + local_1360._0_4_) * fVar76 * fVar52;
                  local_12a0[1] = (fVar54 * auVar63._4_4_ + local_1360._4_4_) * fVar76 * fVar55;
                  local_12a0[2] = (fVar56 * auVar63._8_4_ + local_1360._8_4_) * fVar76 * fVar57;
                  local_12a0[3] = (fVar58 * auVar63._12_4_ + local_1360._12_4_) * fVar76 * fVar59;
                  fStack_1290 = (fVar60 * auVar63._16_4_ + local_1360._16_4_) * fVar76 * 0.0;
                  fStack_128c = (fVar61 * auVar63._20_4_ + local_1360._20_4_) * fVar76 * 0.0;
                  fStack_1288 = (fVar62 * auVar63._24_4_ + local_1360._24_4_) * fVar76 * 0.0;
                  fStack_1284 = fStack_12a4;
                  uVar32 = vmovmskps_avx(local_12e0);
                  uVar36 = 0;
                  uVar38 = CONCAT44((int)((ulong)local_15e0 >> 0x20),uVar32);
                  for (uVar37 = uVar38; (uVar37 & 1) == 0; uVar37 = uVar37 >> 1 | 0x8000000000000000
                      ) {
                    uVar36 = uVar36 + 1;
                  }
                  local_14c0 = auVar114._0_32_;
                  while (uVar38 != 0) {
                    local_1544 = local_12c0[uVar36];
                    local_1540 = local_12a0[uVar36];
                    ray->tfar = *(float *)(local_1280 + uVar36 * 4);
                    local_1520.context = context->user;
                    local_1550 = *(undefined4 *)(local_1260 + uVar36 * 4);
                    local_154c = *(undefined4 *)(local_1240 + uVar36 * 4);
                    local_1548 = *(undefined4 *)(local_1220 + uVar36 * 4);
                    local_1534 = (local_1520.context)->instID[0];
                    local_1530 = (local_1520.context)->instPrimID[0];
                    local_15e4 = -1;
                    local_1520.valid = &local_15e4;
                    local_1520.geometryUserPtr = local_15e0->userPtr;
                    local_1520.hit = (RTCHitN *)&local_1550;
                    local_1520.N = 1;
                    local_153c = uVar75;
                    local_1538 = uVar31;
                    local_1520.ray = (RTCRayN *)ray;
                    if (((local_15e0->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_15e0->occlusionFilterN)(&local_1520), *local_1520.valid != 0)) &&
                       ((pRVar13->filter == (RTCFilterFunctionN)0x0 ||
                        ((((pRVar13->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                           RTC_RAY_QUERY_FLAG_INCOHERENT &&
                          (((local_15e0->field_8).field_0x2 & 0x40) == 0)) ||
                         ((*pRVar13->filter)(&local_1520), *local_1520.valid != 0))))))
                    goto LAB_01538f0c;
                    ray->tfar = (float)local_14f0._0_4_;
                    uVar37 = uVar36 & 0x3f;
                    uVar36 = 0;
                    uVar38 = uVar38 ^ 1L << uVar37;
                    for (uVar37 = uVar38; (uVar37 & 1) == 0;
                        uVar37 = uVar37 >> 1 | 0x8000000000000000) {
                      uVar36 = uVar36 + 1;
                    }
                    auVar114 = ZEXT3264(local_14c0);
                  }
                }
              }
            }
            auVar107 = ZEXT3264(local_13a0);
            auVar110 = ZEXT3264(local_13c0);
            auVar113 = ZEXT3264(local_13e0);
            uVar36 = local_1560;
            uVar37 = local_1568;
            uVar38 = local_1570;
            uVar39 = local_1578;
            uVar41 = local_1580;
            uVar45 = local_1588;
          }
          auVar85 = ZEXT3264(local_1400);
          auVar87 = ZEXT3264(local_1420);
          auVar90 = ZEXT3264(local_1440);
          auVar92 = ZEXT3264(local_1460);
        }
        goto LAB_01538576;
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }